

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QList<QUrl> * __thiscall QMimeData::urls(QMimeData *this)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QList<QUrl> *in_RDI;
  long in_FS_OFFSET;
  QVariant *element;
  QList<QVariant> *__range3;
  QMimeDataPrivate *d;
  QList<QUrl> *urls;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QVariant> list;
  QVariant data;
  QMetaType in_stack_00000368;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QVariant *in_stack_fffffffffffffed0;
  const_iterator local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QMetaTypeInterface *local_60;
  QMetaTypeInterface *local_50;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMimeData *)0x3e5746);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  textUriListLiteral();
  QMetaType::QMetaType((QMetaType *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  QMimeDataPrivate::retrieveTypedData
            ((QMimeDataPrivate *)__range3,(QString *)element,in_stack_00000368);
  QString::~QString((QString *)0x3e57cb);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QUrl>::QList((QList<QUrl> *)0x3e57f2);
  local_50 = (QMetaTypeInterface *)
             ::QVariant::metaType
                       ((QVariant *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar2 = QMetaType::id((QMetaType *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  if (iVar2 == 0x11) {
    ::QVariant::toUrl((QVariant *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QList<QUrl>::append((QList<QUrl> *)in_stack_fffffffffffffed0,
                        (rvalue_ref)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QUrl::~QUrl((QUrl *)in_stack_fffffffffffffed0);
  }
  else {
    local_60 = (QMetaTypeInterface *)
               ::QVariant::metaType
                         ((QVariant *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
    ;
    iVar2 = QMetaType::id((QMetaType *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    if (iVar2 == 9) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toList((QVariant *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_80.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_80 = QList<QVariant>::begin((QList<QVariant> *)in_stack_fffffffffffffed0);
      o = QList<QVariant>::end((QList<QVariant> *)in_stack_fffffffffffffed0);
      while (bVar1 = QList<QVariant>::const_iterator::operator!=(&local_80,o), bVar1) {
        QList<QVariant>::const_iterator::operator*(&local_80);
        ::QVariant::metaType
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        iVar2 = QMetaType::id((QMetaType *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        if (iVar2 == 0x11) {
          ::QVariant::toUrl((QVariant *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          QList<QUrl>::append((QList<QUrl> *)in_stack_fffffffffffffed0,
                              (rvalue_ref)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          QUrl::~QUrl((QUrl *)in_stack_fffffffffffffed0);
        }
        QList<QVariant>::const_iterator::operator++(&local_80);
      }
      QList<QVariant>::~QList((QList<QVariant> *)0x3e5ada);
    }
  }
  ::QVariant::~QVariant(in_stack_fffffffffffffed0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QMimeData::urls() const
{
    Q_D(const QMimeData);
    QVariant data = d->retrieveTypedData(textUriListLiteral(), QMetaType(QMetaType::QVariantList));
    QList<QUrl> urls;
    if (data.metaType().id() == QMetaType::QUrl)
        urls.append(data.toUrl());
    else if (data.metaType().id() == QMetaType::QVariantList) {
        const QList<QVariant> list = data.toList();
        for (const auto &element : list) {
            if (element.metaType().id() == QMetaType::QUrl)
                urls.append(element.toUrl());
        }
    }
    return urls;
}